

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O3

size_t fiobj_ary_each1(FIOBJ o,size_t start_at,_func_int_FIOBJ_void_ptr *task,void *arg)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = *(long *)(o + 0x10) - *(long *)(o + 8);
  uVar3 = uVar4;
  if (start_at < uVar4) {
    do {
      if (uVar4 <= start_at) {
        return start_at;
      }
      lVar1 = start_at * 8;
      start_at = start_at + 1;
      iVar2 = (*task)(*(FIOBJ *)(*(long *)(o + 8) * 8 + *(long *)(o + 0x20) + lVar1),arg);
      uVar3 = start_at;
    } while (iVar2 != -1);
  }
  return uVar3;
}

Assistant:

static size_t fiobj_ary_each1(FIOBJ o, size_t start_at,
                              int (*task)(FIOBJ obj, void *arg), void *arg) {
  return fio_ary___each(&obj2ary(o)->ary, start_at, task, arg);
}